

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CordOutputStream::CordOutputStream
          (CordOutputStream *this,Cord *cord,CordBuffer *buffer,size_t size_hint)

{
  byte bVar1;
  CordRep *pCVar2;
  void *pvVar3;
  ulong uVar4;
  sbyte sVar5;
  ulong uVar6;
  int iVar7;
  sbyte sVar8;
  int iVar9;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CordOutputStream_0035c360;
  pCVar2 = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.cordz_info =
       (cord->contents_).data_.rep_.field_0.as_tree.cordz_info;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.rep = pCVar2;
  (cord->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  (cord->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  this->size_hint_ = size_hint;
  bVar1 = (buffer->rep_).field_0.short_rep.raw_size;
  if ((bVar1 & 1) == 0) {
    uVar4 = (((buffer->rep_).field_0.long_rep.rep)->super_CordRep).length;
  }
  else {
    uVar4 = (ulong)((char)bVar1 >> 1);
  }
  uVar6 = 0xf;
  if ((bVar1 & 1) == 0) {
    bVar1 = (((buffer->rep_).field_0.long_rep.rep)->super_CordRep).tag;
    iVar7 = -0xb8000;
    if (bVar1 < 0xbb) {
      iVar7 = -0xe80;
    }
    sVar8 = 0xc;
    if (bVar1 < 0xbb) {
      sVar8 = 6;
    }
    iVar9 = -0x10;
    if (0x42 < bVar1) {
      iVar9 = iVar7;
    }
    sVar5 = 3;
    if (0x42 < bVar1) {
      sVar5 = sVar8;
    }
    uVar6 = (ulong)(int)(((uint)bVar1 << sVar5) + iVar9 + -0xd);
  }
  this->state_ = (uVar4 < uVar6) + kFull;
  pvVar3 = (buffer->rep_).field_0.long_rep.padding;
  (this->buffer_).rep_.field_0.long_rep.rep = (buffer->rep_).field_0.long_rep.rep;
  (this->buffer_).rep_.field_0.long_rep.padding = pvVar3;
  (buffer->rep_).field_0.short_rep.raw_size = '\x01';
  return;
}

Assistant:

CordOutputStream::CordOutputStream(absl::Cord cord, absl::CordBuffer buffer,
                                   size_t size_hint)
    : cord_(std::move(cord)),
      size_hint_(size_hint),
      state_(buffer.length() < buffer.capacity() ? State::kPartial
                                                 : State::kFull),
      buffer_(std::move(buffer)) {}